

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mipmaps_image *
rf_load_ktx_image_to_buffer
          (rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,
          rf_int dst_size)

{
  ulong uVar1;
  _Bool _Var2;
  rf_pixel_format rVar3;
  size_t __n;
  int *piVar4;
  long lVar5;
  rf_ktx_header header;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  ulong uStack_40;
  
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->mipmaps = 0;
  (__return_storage_ptr__->field_0).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  if (0x40 < (ulong)src_size && src != (void *)0x0) {
    local_78 = *src;
    uStack_70 = *(undefined8 *)((long)src + 8);
    local_68 = *(undefined8 *)((long)src + 0x10);
    uStack_60 = *(undefined8 *)((long)src + 0x18);
    local_48 = *(undefined8 *)((long)src + 0x30);
    uStack_40 = *(ulong *)((long)src + 0x38);
    local_58 = (undefined4)*(undefined8 *)((long)src + 0x20);
    uStack_54 = (undefined4)((ulong)*(undefined8 *)((long)src + 0x20) >> 0x20);
    uStack_50 = (undefined4)*(undefined8 *)((long)src + 0x28);
    uStack_4c = (undefined4)((ulong)*(undefined8 *)((long)src + 0x28) >> 0x20);
    uVar1 = uStack_40 >> 0x20;
    _Var2 = rf_match_str_cstr((char *)((long)&local_78 + 1),6,"KTX 11");
    if (_Var2) {
      lVar5 = src_size - uVar1;
      *(ulong *)((long)&__return_storage_ptr__->field_0 + 8) = CONCAT44(uStack_50,uStack_54);
      __return_storage_ptr__->mipmaps = (int)uStack_40;
      if (4 < lVar5 - 0x40U) {
        piVar4 = (int *)(uVar1 + 0x40 + (long)src);
        __n = (size_t)*piVar4;
        if ((long)__n <= dst_size && lVar5 + -0x44 <= (long)__n) {
          memcpy(dst,piVar4 + 1,__n);
          (__return_storage_ptr__->field_0).image.data = dst;
          if (uStack_60._4_4_ == 0x8d64) {
            rVar3 = RF_COMPRESSED_ETC1_RGB;
          }
          else if (uStack_60._4_4_ == 0x9278) {
            rVar3 = RF_COMPRESSED_ETC2_EAC_RGBA;
          }
          else {
            if (uStack_60._4_4_ != 0x9274) {
              return __return_storage_ptr__;
            }
            rVar3 = RF_COMPRESSED_ETC2_RGB;
          }
          (__return_storage_ptr__->field_0).image.format = rVar3;
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_ktx_image_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size)
{
    rf_mipmaps_image result = {0};

    if (src && src_size > sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            result.width = header.width;
            result.height = header.height;
            result.mipmaps = header.mipmap_levels;

            int image_size = 0;
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&image_size, src, sizeof(unsigned int));
                src = (char*)src + sizeof(unsigned int);
                src_size -= sizeof(unsigned int);

                if (image_size >= src_size && dst_size >= image_size)
                {
                    memcpy(dst, src, image_size);
                    result.data = dst;

                    switch (header.gl_internal_format)
                    {
                        case 0x8D64: result.format = RF_COMPRESSED_ETC1_RGB; break;
                        case 0x9274: result.format = RF_COMPRESSED_ETC2_RGB; break;
                        case 0x9278: result.format = RF_COMPRESSED_ETC2_EAC_RGBA; break;
                        default: return result;
                    }

                    result.valid = true;
                }
            }
        }
    }

    return result;
}